

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

int Gia_ManCollectReachable(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fDumpFile,int fVerbose)

{
  long lVar1;
  Vec_Int_t *vLines;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  Gia_ManEra_t *p_00;
  Gia_ObjEra_t *pGVar9;
  abctime aVar10;
  FILE *__stream;
  undefined1 auVar11 [16];
  FILE *pFile;
  char *pFileName;
  int RetValue;
  abctime clk;
  int Hash;
  Gia_ObjEra_t *pState;
  Gia_ManEra_t *p;
  int fVerbose_local;
  int fDumpFile_local;
  int fMiter_local;
  int nStatesMax_local;
  Gia_Man_t *pAig_local;
  
  aVar8 = Abc_Clock();
  pFileName._4_4_ = 1;
  iVar2 = Gia_ManPiNum(pAig);
  if (0xc < iVar2) {
    __assert_fail("Gia_ManPiNum(pAig) <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0x216,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  iVar2 = Gia_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Gia_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra.c"
                  ,0x217,"int Gia_ManCollectReachable(Gia_Man_t *, int, int, int, int)");
  }
  p_00 = Gia_ManEraCreate(pAig);
  pGVar9 = Gia_ManEraCreateState(p_00);
  pGVar9->Cond = 0;
  pGVar9->iPrev = 0;
  pGVar9->iNext = 0;
  memset(pGVar9 + 1,0,(long)p_00->nWordsDat << 2);
  iVar2 = Gia_ManEraStateHash((uint *)(pGVar9 + 1),p_00->nWordsDat,p_00->nBins);
  p_00->pBins[iVar2] = pGVar9->Num;
  do {
    iVar2 = p_00->iCurState;
    iVar3 = Vec_PtrSize(p_00->vStates);
    if (iVar3 + -1 <= iVar2) {
LAB_008b8c7f:
      iVar2 = p_00->iCurState;
      uVar7 = Gia_ManCountDepth(p_00);
      printf("Reachability analysis traversed %d states with depth %d.  ",(ulong)(iVar2 - 1),
             (ulong)uVar7);
      Abc_Print(1,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar8) * 1.0) / 1000000.0);
      if (fDumpFile != 0) {
        __stream = fopen("test.stg","wb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n","test.stg");
        }
        else {
          vLines = p_00->vStgDump;
          iVar2 = Gia_ManPiNum(pAig);
          iVar3 = Gia_ManPoNum(pAig);
          Gia_ManStgPrint((FILE *)__stream,vLines,iVar2,iVar3,p_00->iCurState + -1);
          fclose(__stream);
          printf("Extracted STG was written into file \"%s\".\n","test.stg");
        }
      }
      Gia_ManEraFree(p_00);
      return pFileName._4_4_;
    }
    iVar2 = Vec_PtrSize(p_00->vStates);
    if (nStatesMax <= iVar2) {
      printf("Reached the limit on states traversed (%d).  ",(ulong)(uint)nStatesMax);
      pFileName._4_4_ = -1;
      goto LAB_008b8c7f;
    }
    iVar2 = p_00->iCurState + 1;
    p_00->iCurState = iVar2;
    pGVar9 = Gia_ManEraState(p_00,iVar2);
    if ((p_00->iCurState < 2) || (pGVar9->iPrev != 0)) {
      Gia_ManInsertState(p_00,pGVar9);
      Gia_ManPerformOneIter(p_00);
      iVar2 = Gia_ManAnalyzeResult(p_00,pGVar9,fMiter,fDumpFile);
      if ((iVar2 != 0) && (fMiter != 0)) {
        pFileName._4_4_ = 0;
        uVar7 = p_00->iCurState;
        iVar2 = Vec_IntSize(p_00->vBugTrace);
        printf("Miter failed in state %d after %d transitions.  ",(ulong)uVar7,(ulong)(iVar2 - 1));
        goto LAB_008b8c7f;
      }
      if ((fVerbose != 0) && (p_00->iCurState % 5000 == 0)) {
        uVar7 = p_00->iCurState;
        uVar4 = Vec_PtrSize(p_00->vStates);
        iVar2 = p_00->iCurState;
        iVar3 = Vec_PtrSize(p_00->vStates);
        uVar5 = Gia_ManCountDepth(p_00);
        iVar6 = Vec_PtrSize(p_00->vStates);
        lVar1 = (long)p_00->nWordsDat * 4 + 0x10;
        auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar11._0_8_ = lVar1;
        auVar11._12_4_ = 0x45300000;
        printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",
               (double)iVar2 / (double)iVar3,
               ((double)p_00->vStates->nCap * 1.0 * 8.0 +
               (double)iVar6 *
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
               (double)p_00->nBins * 1.0 * 4.0) * 9.5367431640625e-07,(ulong)uVar7,(ulong)uVar4,
               (ulong)uVar5);
        Abc_Print(1,"%s =","Time");
        aVar10 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar8) * 1.0) / 1000000.0);
      }
    }
  } while( true );
}

Assistant:

int Gia_ManCollectReachable( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fDumpFile, int fVerbose )
{ 
    Gia_ManEra_t * p;
    Gia_ObjEra_t * pState;
    int Hash;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    assert( Gia_ManPiNum(pAig) <= 12 );
    assert( Gia_ManRegNum(pAig) > 0 );
    p = Gia_ManEraCreate( pAig );
    // create init state
    pState = Gia_ManEraCreateState( p );
    pState->Cond  = 0; 
    pState->iPrev = 0;
    pState->iNext = 0; 
    memset( pState->pData, 0, sizeof(unsigned) * p->nWordsDat );
    Hash = Gia_ManEraStateHash(pState->pData, p->nWordsDat, p->nBins);
    p->pBins[ Hash ] = pState->Num;
    // process reachable states
    while ( p->iCurState < Vec_PtrSize( p->vStates ) - 1 )
    {
        if ( Vec_PtrSize(p->vStates) >= nStatesMax )
        {
            printf( "Reached the limit on states traversed (%d).  ", nStatesMax );
            RetValue = -1;
            break;
        }
        pState = Gia_ManEraState( p, ++p->iCurState );
        if ( p->iCurState > 1 && pState->iPrev == 0 )
            continue;
//printf( "Extracting %d  ", p->iCurState );
//Extra_PrintBinary( stdout, p->pStateNew->pData, Gia_ManRegNum(p->pAig) );  printf( "\n" );
        Gia_ManInsertState( p, pState );
        Gia_ManPerformOneIter( p );
        if ( Gia_ManAnalyzeResult( p, pState, fMiter, fDumpFile ) && fMiter )
        {
            RetValue = 0;
            printf( "Miter failed in state %d after %d transitions.  ", 
                p->iCurState, Vec_IntSize(p->vBugTrace)-1 );
            break;
        }
        if ( fVerbose && p->iCurState % 5000 == 0 )
        {
            printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
                p->iCurState, Vec_PtrSize(p->vStates), 1.0*p->iCurState/Vec_PtrSize(p->vStates), Gia_ManCountDepth(p), 
                (1.0/(1<<20))*(1.0*Vec_PtrSize(p->vStates)*(sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat) + 
                   1.0*p->nBins*sizeof(unsigned) + 1.0*p->vStates->nCap * sizeof(void*)) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    printf( "Reachability analysis traversed %d states with depth %d.  ", p->iCurState-1, Gia_ManCountDepth(p) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( fDumpFile )
    {
        char * pFileName = "test.stg";
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            Gia_ManStgPrint( pFile, p->vStgDump, Gia_ManPiNum(pAig), Gia_ManPoNum(pAig), p->iCurState-1 );
            fclose( pFile );
            printf( "Extracted STG was written into file \"%s\".\n", pFileName );
        }
    }
    Gia_ManEraFree( p );
    return RetValue;
}